

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O1

type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void> *
pybind11::detail::load_type<std::__cxx11::string,void>
          (type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
           *conv,handle *handle)

{
  bool bVar1;
  runtime_error *this;
  long *plVar2;
  long *plVar3;
  object *object;
  str sStack_88;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  enable_if_t<_detail::is_pyobject<basic_string<char>_>::value_&&_detail::move_if_unreferenced<basic_string<char>_>::value,_std::__cxx11::basic_string<char>_>
  local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  bVar1 = string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
          ::load(&conv->
                  super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                 ,(handle)handle->m_ptr,true);
  if (bVar1) {
    return conv;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  str::str(&sStack_88,(PyObject *)handle->m_ptr->ob_type);
  cast<std::__cxx11::string>(&local_60,(pybind11 *)&sStack_88,object);
  std::operator+(&local_40,"Unable to cast Python instance of type ",&local_60);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_40);
  local_80 = (long *)*plVar2;
  plVar3 = plVar2 + 2;
  if (local_80 == plVar3) {
    local_70 = *plVar3;
    lStack_68 = plVar2[3];
    local_80 = &local_70;
  }
  else {
    local_70 = *plVar3;
  }
  local_78 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::runtime_error::runtime_error(this,(string *)&local_80);
  *(undefined ***)this = &PTR__runtime_error_0012e988;
  __cxa_throw(this,&cast_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

type_caster<T, SFINAE> &load_type(type_caster<T, SFINAE> &conv, const handle &handle) {
    static_assert(!detail::is_pyobject<T>::value,
                  "Internal error: type_caster should only be used for C++ types");
    if (!conv.load(handle, true)) {
#if !defined(PYBIND11_DETAILED_ERROR_MESSAGES)
        throw cast_error(
            "Unable to cast Python instance of type "
            + str(type::handle_of(handle)).cast<std::string>()
            + " to C++ type '?' (#define "
              "PYBIND11_DETAILED_ERROR_MESSAGES or compile in debug mode for details)");
#else
        throw cast_error("Unable to cast Python instance of type "
                         + str(type::handle_of(handle)).cast<std::string>() + " to C++ type '"
                         + type_id<T>() + "'");
#endif
    }
    return conv;
}